

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_expressions.cpp
# Opt level: O0

ExpressionSyntax * __thiscall
slang::parsing::Parser::parseBinaryExpression
          (Parser *this,ExpressionSyntax *left,
          bitmask<slang::parsing::detail::ExpressionOptions> options,int precedence)

{
  SourceRange range;
  span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> elements;
  span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> elements_00;
  Token operatorToken;
  Token question_00;
  Token colon_00;
  AttrList attributes_00;
  AttrList attributes_01;
  TokenKind kind;
  undefined8 uVar1;
  bool bVar2;
  ConditionalPredicateSyntax *predicate_00;
  __extent_storage<18446744073709551615UL> this_00;
  int in_ECX;
  underlying_type in_EDX;
  ConditionalExpressionSyntax *in_RSI;
  long in_RDI;
  Token TVar3;
  int in_stack_0000000c;
  Parser *in_stack_00000010;
  bitmask<slang::parsing::detail::ExpressionOptions> in_stack_0000001c;
  ExpressionSyntax *rhs;
  Token colon;
  ExpressionSyntax *lhs;
  AttrList attributes_1;
  ConditionalPredicateSyntax *predicate;
  Token question;
  bool takeConditional;
  int logicalOrPrecedence;
  ExpressionSyntax *rightOperand;
  AttrList attributes;
  Token opToken;
  DistConstraintListSyntax *dist;
  int newPrecedence;
  SyntaxKind opKind;
  Token current;
  ParserBase *in_stack_fffffffffffffd58;
  Diagnostic *in_stack_fffffffffffffd60;
  undefined4 in_stack_fffffffffffffd68;
  SyntaxKind in_stack_fffffffffffffd6c;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffd70;
  Parser *in_stack_fffffffffffffd78;
  ConditionalPredicateSyntax *pCVar4;
  undefined7 in_stack_fffffffffffffd80;
  undefined1 in_stack_fffffffffffffd87;
  ExpressionSyntax *in_stack_fffffffffffffd88;
  undefined4 in_stack_fffffffffffffd90;
  SyntaxKind in_stack_fffffffffffffd94;
  ConditionalExpressionSyntax *in_stack_fffffffffffffd98;
  undefined7 in_stack_fffffffffffffda0;
  undefined1 in_stack_fffffffffffffda7;
  undefined4 in_stack_fffffffffffffdb0;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  ParserBase *in_stack_fffffffffffffdc0;
  SourceLocation in_stack_fffffffffffffdc8;
  Parser *in_stack_fffffffffffffdd0;
  pointer in_stack_fffffffffffffdd8;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffde0;
  TokenKind in_stack_fffffffffffffdee;
  ParserBase *in_stack_fffffffffffffdf0;
  ExpressionSyntax *local_1c8;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *local_1c0;
  Parser *in_stack_fffffffffffffe58;
  bitmask<slang::parsing::detail::ExpressionOptions> local_194;
  AttrList local_190;
  ConditionalPredicateSyntax *local_180;
  bool local_161;
  bitmask<slang::parsing::detail::ExpressionOptions> local_160;
  int local_15c;
  pointer local_158;
  size_t local_150;
  bitmask<slang::parsing::detail::ExpressionOptions> local_144;
  pointer local_140;
  size_t local_138;
  undefined8 local_f8;
  Info *local_f0;
  underlying_type local_e4;
  ParserBase *local_e0;
  AttrList local_d8;
  Token local_c8;
  SourceRange local_b8;
  SourceLocation in_stack_ffffffffffffff58;
  TokenKind in_stack_ffffffffffffff66;
  DistConstraintListSyntax *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  bitmask<slang::parsing::detail::ExpressionOptions> local_88;
  bitmask<slang::parsing::detail::ExpressionOptions> local_84;
  Token local_80;
  Parser *this_01;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> in_stack_ffffffffffffff90;
  TokenKind local_60;
  bitmask<slang::parsing::detail::ExpressionOptions> local_4c;
  bitmask<slang::parsing::detail::ExpressionOptions> local_48;
  SyntaxKind local_44;
  Token local_40;
  undefined8 local_30;
  Info *local_28;
  int local_1c;
  ConditionalExpressionSyntax *local_18;
  bitmask<slang::parsing::detail::ExpressionOptions> local_4;
  
  local_1c = in_ECX;
  local_18 = in_RSI;
  local_4.m_bits = in_EDX;
  Token::Token((Token *)in_stack_fffffffffffffd60);
  while( true ) {
    TVar3 = ParserBase::peek(in_stack_fffffffffffffd58);
    local_40._0_8_ = TVar3._0_8_;
    local_30._0_2_ = local_40.kind;
    local_30._2_1_ = local_40._2_1_;
    local_30._3_1_ = local_40.numFlags.raw;
    local_30._4_4_ = local_40.rawLen;
    uVar1 = local_30;
    local_40.info = TVar3.info;
    local_28 = local_40.info;
    local_30._0_2_ = TVar3.kind;
    kind = (TokenKind)local_30;
    local_40 = TVar3;
    local_30 = uVar1;
    local_44 = slang::syntax::SyntaxFacts::getBinaryExpression(kind);
    this_01 = (Parser *)in_stack_ffffffffffffff90._M_ptr;
    if (local_44 == Unknown) break;
    uVar8 = false;
    if (local_44 == LogicalImplicationExpression) {
      bitmask<slang::parsing::detail::ExpressionOptions>::bitmask(&local_48,ConstraintContext);
      uVar8 = bitmask<slang::parsing::detail::ExpressionOptions>::has
                        ((bitmask<slang::parsing::detail::ExpressionOptions> *)
                         in_stack_fffffffffffffd60,
                         (bitmask<slang::parsing::detail::ExpressionOptions> *)
                         in_stack_fffffffffffffd58);
    }
    this_01 = (Parser *)in_stack_ffffffffffffff90._M_ptr;
    if ((bool)uVar8 != false) break;
    if ((local_44 == LogicalAndExpression) || (uVar7 = false, local_44 == LogicalOrExpression)) {
      bitmask<slang::parsing::detail::ExpressionOptions>::bitmask(&local_4c,BinsSelectContext);
      uVar7 = bitmask<slang::parsing::detail::ExpressionOptions>::has
                        ((bitmask<slang::parsing::detail::ExpressionOptions> *)
                         in_stack_fffffffffffffd60,
                         (bitmask<slang::parsing::detail::ExpressionOptions> *)
                         in_stack_fffffffffffffd58);
    }
    this_01 = (Parser *)in_stack_ffffffffffffff90._M_ptr;
    if ((bool)uVar7 != false) break;
    uVar6 = false;
    if (local_44 == MultiplyExpression) {
      TVar3 = ParserBase::peek((ParserBase *)
                               CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),
                               (uint32_t)((ulong)in_stack_fffffffffffffd60 >> 0x20));
      local_60 = TVar3.kind;
      uVar6 = false;
      if (local_60 == CloseParenthesis) {
        local_80 = ParserBase::peek((ParserBase *)
                                    CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),
                                    (uint32_t)((ulong)in_stack_fffffffffffffd60 >> 0x20));
        in_stack_ffffffffffffff90 =
             Token::trivia((Token *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80));
        uVar6 = std::span<const_slang::parsing::Trivia,_18446744073709551615UL>::empty
                          ((span<const_slang::parsing::Trivia,_18446744073709551615UL> *)0xa1e3df);
      }
    }
    this_01 = (Parser *)in_stack_ffffffffffffff90._M_ptr;
    if ((bool)uVar6 != false) break;
    uVar5 = false;
    if (local_44 == LessThanEqualExpression) {
      bitmask<slang::parsing::detail::ExpressionOptions>::bitmask
                (&local_84,ProceduralAssignmentContext);
      uVar5 = bitmask<slang::parsing::detail::ExpressionOptions>::has
                        ((bitmask<slang::parsing::detail::ExpressionOptions> *)
                         in_stack_fffffffffffffd60,
                         (bitmask<slang::parsing::detail::ExpressionOptions> *)
                         in_stack_fffffffffffffd58);
    }
    if ((bool)uVar5 != false) {
      local_44 = NonblockingAssignmentExpression;
    }
    local_88 = detail::operator~((ExpressionOptions)in_stack_fffffffffffffd60);
    bitmask<slang::parsing::detail::ExpressionOptions>::operator&=(&local_4,&local_88);
    in_stack_ffffffffffffff74 = slang::syntax::SyntaxFacts::getPrecedence(local_44);
    this_01 = (Parser *)in_stack_ffffffffffffff90._M_ptr;
    if (in_stack_ffffffffffffff74 < local_1c) break;
    if (in_stack_ffffffffffffff74 == local_1c) {
      bVar2 = slang::syntax::SyntaxFacts::isRightAssociative(local_44);
      this_01 = (Parser *)in_stack_ffffffffffffff90._M_ptr;
      if (!bVar2) break;
    }
    if (local_44 == InsideExpression) {
      local_18 = (ConditionalExpressionSyntax *)
                 parseInsideExpression
                           ((Parser *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                            in_stack_fffffffffffffd88);
    }
    else if (local_44 == ExpressionOrDist) {
      in_stack_ffffffffffffff68 = parseDistConstraintList(in_stack_fffffffffffffe58);
      local_18 = (ConditionalExpressionSyntax *)
                 slang::syntax::SyntaxFactory::expressionOrDist
                           ((SyntaxFactory *)in_stack_fffffffffffffd60,
                            (ExpressionSyntax *)in_stack_fffffffffffffd58,
                            (DistConstraintListSyntax *)0xa1e530);
      bitmask<slang::parsing::detail::ExpressionOptions>::bitmask
                ((bitmask<slang::parsing::detail::ExpressionOptions> *)&stack0xffffffffffffff64,
                 AllowDist);
      bVar2 = bitmask<slang::parsing::detail::ExpressionOptions>::has
                        ((bitmask<slang::parsing::detail::ExpressionOptions> *)
                         in_stack_fffffffffffffd60,
                         (bitmask<slang::parsing::detail::ExpressionOptions> *)
                         in_stack_fffffffffffffd58);
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        in_stack_ffffffffffffff58 = Token::location(&in_stack_ffffffffffffff68->dist);
        ParserBase::addDiag(in_stack_fffffffffffffdc0,
                            SUB84((ulong)in_stack_fffffffffffffdd0 >> 0x20,0),
                            in_stack_fffffffffffffdc8);
        local_b8 = slang::syntax::SyntaxNode::sourceRange
                             ((SyntaxNode *)
                              CONCAT17(uVar8,CONCAT16(uVar7,CONCAT15(uVar6,CONCAT14(uVar5,
                                                  in_stack_fffffffffffffdb0)))));
        range.startLoc._4_4_ = in_stack_fffffffffffffd6c;
        range.startLoc._0_4_ = in_stack_fffffffffffffd68;
        range.endLoc = (SourceLocation)in_stack_fffffffffffffd70._M_extent_value;
        Diagnostic::operator<<(in_stack_fffffffffffffd60,range);
      }
    }
    else {
      local_c8 = ParserBase::consume((ParserBase *)
                                     CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80));
      local_d8 = parseAttributes((Parser *)in_stack_ffffffffffffff90._M_ptr);
      local_e4 = local_4.m_bits;
      local_e0 = (ParserBase *)
                 parseSubExpression(in_stack_00000010,in_stack_0000001c,in_stack_0000000c);
      TVar3 = local_c8;
      in_stack_fffffffffffffd88 = (ExpressionSyntax *)(in_RDI + 0xe0);
      local_f8._0_2_ = local_c8.kind;
      local_f8._2_1_ = local_c8._2_1_;
      local_f8._3_1_ = local_c8.numFlags.raw;
      local_f8._4_4_ = local_c8.rawLen;
      local_c8.info = TVar3.info;
      local_f0 = local_c8.info;
      local_140 = local_d8._M_ptr;
      local_138 = local_d8._M_extent._M_extent_value;
      elements._M_ptr._4_4_ = in_stack_fffffffffffffd6c;
      elements._M_ptr._0_4_ = in_stack_fffffffffffffd68;
      elements._M_extent._M_extent_value = in_stack_fffffffffffffd70._M_extent_value;
      in_stack_fffffffffffffd94 = local_44;
      in_stack_fffffffffffffd98 = local_18;
      local_c8 = TVar3;
      slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
                ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)in_stack_fffffffffffffd60,
                 elements);
      operatorToken.info._0_7_ = in_stack_fffffffffffffd80;
      operatorToken._0_8_ = in_stack_fffffffffffffd78;
      operatorToken.info._7_1_ = in_stack_fffffffffffffd87;
      in_stack_fffffffffffffd58 = local_e0;
      local_18 = (ConditionalExpressionSyntax *)
                 slang::syntax::SyntaxFactory::binaryExpression
                           ((SyntaxFactory *)in_stack_fffffffffffffd70._M_extent_value,
                            in_stack_fffffffffffffd6c,(ExpressionSyntax *)in_stack_fffffffffffffd60,
                            operatorToken,
                            (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)local_e0,
                            (ExpressionSyntax *)
                            CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
      bVar2 = slang::syntax::SyntaxFacts::isAssignmentOperator(local_44);
      in_stack_fffffffffffffda7 = true;
      if (!bVar2) {
        bitmask<slang::parsing::detail::ExpressionOptions>::bitmask(&local_144,DisallowAttrs);
        in_stack_fffffffffffffda7 =
             bitmask<slang::parsing::detail::ExpressionOptions>::has
                       ((bitmask<slang::parsing::detail::ExpressionOptions> *)
                        in_stack_fffffffffffffd60,
                        (bitmask<slang::parsing::detail::ExpressionOptions> *)
                        in_stack_fffffffffffffd58);
      }
      if ((bool)in_stack_fffffffffffffda7 != false) {
        local_158 = local_d8._M_ptr;
        local_150 = local_d8._M_extent._M_extent_value;
        attributes_00._M_extent._M_extent_value = in_stack_fffffffffffffde0._M_extent_value;
        attributes_00._M_ptr = in_stack_fffffffffffffdd8;
        errorIfAttributes(in_stack_fffffffffffffdd0,attributes_00);
      }
    }
  }
  local_15c = slang::syntax::SyntaxFacts::getPrecedence(LogicalOrExpression);
  bitmask<slang::parsing::detail::ExpressionOptions>::bitmask(&local_160,PatternContext);
  bVar2 = bitmask<slang::parsing::detail::ExpressionOptions>::has
                    ((bitmask<slang::parsing::detail::ExpressionOptions> *)in_stack_fffffffffffffd60
                     ,(bitmask<slang::parsing::detail::ExpressionOptions> *)
                      in_stack_fffffffffffffd58);
  uVar8 = !bVar2 && local_1c < local_15c;
  if ((bool)uVar8) {
    local_161 = (TokenKind)local_30 == 0x2d;
    if (((TokenKind)local_30 == 0xd6) || ((TokenKind)local_30 == 0x5b)) {
      local_161 = isConditionalExpression(in_stack_fffffffffffffd78);
    }
    if (local_161 != false) {
      Token::Token((Token *)in_stack_fffffffffffffd60);
      local_180 = parseConditionalPredicate
                            ((Parser *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70)
                             ,(ExpressionSyntax *)in_stack_ffffffffffffff68,
                             in_stack_ffffffffffffff66,(Token *)in_stack_ffffffffffffff58);
      local_190 = parseAttributes(this_01);
      bitmask<slang::parsing::detail::ExpressionOptions>::bitmask(&local_194,DisallowAttrs);
      bVar2 = bitmask<slang::parsing::detail::ExpressionOptions>::has
                        ((bitmask<slang::parsing::detail::ExpressionOptions> *)
                         in_stack_fffffffffffffd60,
                         (bitmask<slang::parsing::detail::ExpressionOptions> *)
                         in_stack_fffffffffffffd58);
      if (bVar2) {
        attributes_01._M_extent._M_extent_value = in_stack_fffffffffffffde0._M_extent_value;
        attributes_01._M_ptr = in_stack_fffffffffffffdd8;
        errorIfAttributes(in_stack_fffffffffffffdd0,attributes_01);
      }
      parseSubExpression(in_stack_00000010,in_stack_0000001c,in_stack_0000000c);
      TVar3 = ParserBase::expect(in_stack_fffffffffffffdf0,in_stack_fffffffffffffdee);
      predicate_00 = (ConditionalPredicateSyntax *)
                     parseSubExpression(in_stack_00000010,in_stack_0000001c,in_stack_0000000c);
      this_00._M_extent_value = in_RDI + 0xe0;
      elements_00._M_ptr._4_4_ = in_stack_fffffffffffffd6c;
      elements_00._M_ptr._0_4_ = in_stack_fffffffffffffd68;
      elements_00._M_extent._M_extent_value = this_00._M_extent_value;
      pCVar4 = local_180;
      slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
                ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)in_stack_fffffffffffffd60,
                 elements_00);
      local_1c8 = TVar3._0_8_;
      local_1c0 = (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)TVar3.info;
      question_00.info._0_7_ = in_stack_fffffffffffffd80;
      question_00._0_8_ = pCVar4;
      question_00.info._7_1_ = uVar8;
      colon_00.rawLen = in_stack_fffffffffffffd94;
      colon_00.kind = (short)in_stack_fffffffffffffd90;
      colon_00._2_1_ = (char)((uint)in_stack_fffffffffffffd90 >> 0x10);
      colon_00.numFlags.raw = (char)((uint)in_stack_fffffffffffffd90 >> 0x18);
      colon_00.info = (Info *)in_stack_fffffffffffffd98;
      local_18 = slang::syntax::SyntaxFactory::conditionalExpression
                           ((SyntaxFactory *)this_00._M_extent_value,predicate_00,question_00,
                            local_1c0,local_1c8,colon_00,
                            (ExpressionSyntax *)
                            CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0));
    }
  }
  return &local_18->super_ExpressionSyntax;
}

Assistant:

ExpressionSyntax& Parser::parseBinaryExpression(ExpressionSyntax* left,
                                                bitmask<ExpressionOptions> options,
                                                int precedence) {
    Token current;
    while (true) {
        // either a binary operator, or we're done
        current = peek();
        auto opKind = getBinaryExpression(current.kind);
        if (opKind == SyntaxKind::Unknown) {
            break;
        }
        else if (opKind == SyntaxKind::LogicalImplicationExpression &&
                 options.has(ExpressionOptions::ConstraintContext)) {
            // the implication operator in constraint blocks is special, we don't handle it here
            break;
        }
        else if ((opKind == SyntaxKind::LogicalAndExpression ||
                  opKind == SyntaxKind::LogicalOrExpression) &&
                 options.has(ExpressionOptions::BinsSelectContext)) {
            // The && and || operators in a bins select expression are part of the bins select
            // and not part of this nested sub expression.
            break;
        }
        else if (opKind == SyntaxKind::MultiplyExpression &&
                 peek(1).kind == TokenKind::CloseParenthesis && peek(1).trivia().empty()) {
            // This is an end-of-attribute token, not a multiply.
            break;
        }
        else if (opKind == SyntaxKind::LessThanEqualExpression &&
                 options.has(ExpressionOptions::ProceduralAssignmentContext)) {
            // we have to special case '<=', which can be less than or nonblocking assignment
            // depending
            // on context
            opKind = SyntaxKind::NonblockingAssignmentExpression;
        }

        options &= ~ExpressionOptions::ProceduralAssignmentContext;

        // see if we should take this operator or if it's part of our parent due to precedence
        int newPrecedence = getPrecedence(opKind);
        if (newPrecedence < precedence)
            break;

        // if we have a precedence tie, check associativity
        if (newPrecedence == precedence && !isRightAssociative(opKind))
            break;

        // take the operator
        if (opKind == SyntaxKind::InsideExpression) {
            left = &parseInsideExpression(*left);
        }
        else if (opKind == SyntaxKind::ExpressionOrDist) {
            auto& dist = parseDistConstraintList();
            left = &factory.expressionOrDist(*left, dist);

            if (!options.has(ExpressionOptions::AllowDist)) {
                addDiag(diag::InvalidDistExpression, dist.dist.location()) << dist.sourceRange();
            }
        }
        else {
            auto opToken = consume();
            auto attributes = parseAttributes();
            auto& rightOperand = parseSubExpression(options, newPrecedence);
            left = &factory.binaryExpression(opKind, *left, opToken, attributes, rightOperand);

            if (isAssignmentOperator(opKind) || options.has(ExpressionOptions::DisallowAttrs))
                errorIfAttributes(attributes);
        }
    }

    // Handle conditional expressions (and their optional pattern matched predicate).
    // Only do this if we're not already within a conditional pattern context, and if
    // we're at the right precedence level (one lower than a logical-or) to take it.
    int logicalOrPrecedence = getPrecedence(SyntaxKind::LogicalOrExpression);
    if (!options.has(ExpressionOptions::PatternContext) && precedence < logicalOrPrecedence) {
        // If this is the start of a pattern predicate, check whether there's actually a
        // question mark coming up. Otherwise we might be a predicate inside a
        // statement which doesn't need the question.
        bool takeConditional = current.kind == TokenKind::Question;
        if (current.kind == TokenKind::MatchesKeyword || current.kind == TokenKind::TripleAnd)
            takeConditional = isConditionalExpression();

        if (takeConditional) {
            Token question;
            auto& predicate = parseConditionalPredicate(*left, TokenKind::Question, question);
            auto attributes = parseAttributes();
            if (options.has(ExpressionOptions::DisallowAttrs))
                errorIfAttributes(attributes);

            auto& lhs = parseSubExpression(options, logicalOrPrecedence - 1);
            auto colon = expect(TokenKind::Colon);
            auto& rhs = parseSubExpression(options, logicalOrPrecedence - 1);
            left = &factory.conditionalExpression(predicate, question, attributes, lhs, colon, rhs);
        }
    }

    return *left;
}